

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerMain.cpp
# Opt level: O0

int __thiscall Analysis::LexicalAnalysis::Run(LexicalAnalysis *this)

{
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> Code;
  vector<int,_std::allocator<int>_> Table;
  LexicalAnalysis *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &Code.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  ReadFile(this,(vector<char,_std::allocator<char>_> *)local_40);
  PreTokenize(this,(vector<char,_std::allocator<char>_> *)local_40,
              (vector<int,_std::allocator<int>_> *)
              &Code.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  Tokenize(this,(vector<char,_std::allocator<char>_> *)local_40,
           (vector<int,_std::allocator<int>_> *)
           &Code.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  SpaceHandle(this);
  Assign(this);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &Code.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return 0;
}

Assistant:

int LexicalAnalysis::Run() {

        //the vector to store the types of the chars. (parallel to Code)
        std::vector<int> Table;
        //the vector to store the chars of the code (parallel to Table)
        std::vector<char> Code;

        ReadFile(Code);
        PreTokenize(Code, Table);
        Tokenize(Code, Table);
        SpaceHandle();
        Assign();

        return 0;
    }